

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O3

int kvtree_exchange(kvtree *send,kvtree *recv,MPI_Comm comm)

{
  MPI_Comm comm_00;
  uint uVar1;
  kvtree_elem *elem;
  kvtree *pkVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  int max_steps [2];
  int ranks;
  int rank;
  kvtree *right;
  kvtree *left;
  int all_steps [2];
  int local_8c;
  undefined8 local_80;
  uint local_78;
  int local_74;
  kvtree *local_70;
  kvtree *local_68;
  kvtree *local_60;
  MPI_Comm local_58;
  kvtree *local_50;
  kvtree *local_48;
  kvtree *local_40;
  int local_38;
  int local_34;
  
  local_60 = recv;
  MPI_Comm_rank(comm,&local_74);
  local_58 = comm;
  MPI_Comm_size(comm,&local_78);
  local_70 = kvtree_new();
  local_40 = local_70;
  local_68 = kvtree_new();
  local_80 = 0;
  local_48 = local_68;
  elem = kvtree_elem_first(send);
  if (elem != (kvtree_elem *)0x0) {
    iVar6 = 0;
    local_8c = 0;
    do {
      uVar1 = kvtree_elem_key_int(elem);
      local_50 = kvtree_elem_hash(elem);
      iVar8 = 0;
      iVar9 = 0;
      iVar7 = 0;
      iVar3 = 0;
      if (1 < (int)local_78) {
        iVar4 = 1;
        iVar3 = 0;
        uVar5 = 1;
        iVar9 = 0;
        iVar8 = 0;
        do {
          bVar10 = (uVar5 & ((int)(local_74 - uVar1) >> 0x1f & local_78) + (local_74 - uVar1)) != 0;
          if (bVar10) {
            iVar7 = iVar4;
          }
          iVar8 = iVar8 + (uint)bVar10;
          bVar10 = (uVar5 & ((int)(uVar1 - local_74) >> 0x1f & local_78) + (uVar1 - local_74)) != 0;
          if (bVar10) {
            iVar3 = iVar4;
          }
          iVar9 = iVar9 + (uint)bVar10;
          uVar5 = uVar5 * 2;
          iVar4 = iVar4 + 1;
        } while ((int)uVar5 < (int)local_78);
      }
      pkVar2 = kvtree_new();
      kvtree_merge(pkVar2,local_50);
      if (iVar8 < iVar9) {
        kvtree_setf(local_70,pkVar2,"%d",(ulong)uVar1);
        if (iVar6 < iVar7) {
          local_80 = CONCAT44(local_80._4_4_,iVar7);
          iVar6 = iVar7;
        }
      }
      else {
        kvtree_setf(local_68,pkVar2,"%d",(ulong)uVar1);
        if (local_8c < iVar3) {
          local_80 = CONCAT44(iVar3,(undefined4)local_80);
          local_8c = iVar3;
        }
      }
      elem = kvtree_elem_next(elem);
    } while (elem != (kvtree_elem *)0x0);
  }
  comm_00 = local_58;
  MPI_Allreduce(&local_80,&local_38,2,&ompi_mpi_int,&ompi_mpi_op_max,local_58);
  pkVar2 = local_60;
  kvtree_exchange_direction_hops(local_70,local_60,comm_00,KVTREE_EXCHANGE_LEFT,local_38);
  kvtree_exchange_direction_hops(local_68,pkVar2,comm_00,KVTREE_EXCHANGE_RIGHT,local_34);
  kvtree_delete(&local_48);
  kvtree_delete(&local_40);
  return 0;
}

Assistant:

int kvtree_exchange(const kvtree* send, kvtree* recv, MPI_Comm comm)
{
  /* get our rank and number of ranks in comm */
  int rank, ranks;
  MPI_Comm_rank(comm, &rank);
  MPI_Comm_size(comm, &ranks);

  /* Since we have two paths, we try to be more efficient by sending
   * each item in the direction of fewest hops.  For example, consider
   * an 11 task job in which rank 0 wants to send to rank 8.
   * Rank 8 is closer to rank 0 from the left (dist = 3) than the
   * right (dist = 8).  However rank 0 can send to rank 8 using
   * a single hop (direct send) going right whereas the data takes 2
   * hops to go left. In this case, we send the data to the right to
   * minimize the number of hops. */
  kvtree* left  = kvtree_new();
  kvtree* right = kvtree_new();

  /* we compute maximum steps needed to each side */
  int max_steps[2];
  max_steps[STEPS_LEFT]  = 0;
  max_steps[STEPS_RIGHT] = 0;

  /* iterate through elements and assign to left or right hash */
  kvtree_elem* elem;
  for (elem = kvtree_elem_first(send);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    /* get dest rank and pointer to hash for that rank */
    int dest = kvtree_elem_key_int(elem);
    kvtree* elem_hash = kvtree_elem_hash(elem);

    /* compute distance to our left */
    int dist_left = rank - dest;
    if (dist_left < 0) {
      dist_left += ranks;
    }

    /* compute distance to our right */
    int dist_right = dest - rank;
    if (dist_right < 0) {
      dist_right += ranks;
    }

    /* count hops in each direction */
    int hops_left = 0;
    int hops_right = 0;
    int dist = 1;
    int step = 1;
    int steps_left  = 0;
    int steps_right = 0;
    while (dist < ranks) {
      /* if distance is odd in this bit,
       * we'd send it during this step */
      if (dist_left & dist) {
        hops_left++;
        steps_left = step;
      }
      if (dist_right & dist) {
        hops_right++;
        steps_right = step;
      }

      /* go to the next step */
      dist <<= 1;
      step++;
    }

    /* assign to hash having the fewest hops */
    kvtree* tmp = kvtree_new();
    kvtree_merge(tmp, elem_hash);
    if (hops_left < hops_right) {
      /* assign to left-going exchange */
      kvtree_setf(left, tmp, "%d", dest);
      if (steps_left > max_steps[STEPS_LEFT]) {
        max_steps[STEPS_LEFT] = steps_left;
      }
    } else {
      /* assign to right-going exchange */
      kvtree_setf(right, tmp, "%d", dest);
      if (steps_right > max_steps[STEPS_RIGHT]) {
        max_steps[STEPS_RIGHT] = steps_right;
      }
    }
  }

  /* most hash exchanges have a small number of hops
   * compared to the size of the job, so determine max
   * hops counts with allreduce and cut exchange off early */
  int all_steps[2];
  MPI_Allreduce(max_steps, all_steps, 2, MPI_INT, MPI_MAX, comm);

  /* delegate work to kvtree_exchange_direction */
  int rc = kvtree_exchange_direction_hops(
    left, recv, comm, KVTREE_EXCHANGE_LEFT, all_steps[STEPS_LEFT]
  );
  int right_rc = kvtree_exchange_direction_hops(
    right, recv, comm, KVTREE_EXCHANGE_RIGHT, all_steps[STEPS_RIGHT]
  );
  if (rc == KVTREE_SUCCESS) {
    rc = right_rc;
  }

  /* free our left and right hashes */
  kvtree_delete(&right);
  kvtree_delete(&left);

  return rc;
}